

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UFFAdapter.cpp
# Opt level: O2

UFFAtypeParameters * __thiscall
OpenMD::UFFAdapter::getUFFParam(UFFAtypeParameters *__return_storage_ptr__,UFFAdapter *this)

{
  bool bVar1;
  long lVar2;
  UFFAtypeParameters *pUVar3;
  UFFAtypeParameters *pUVar4;
  byte bVar5;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>_> uffData;
  shared_ptr<OpenMD::GenericData> data;
  string local_48;
  
  bVar5 = 0;
  bVar1 = isUFF(this);
  if (!bVar1) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "UFFAdapter::getUFFParam was passed an atomType (%s)\n\tthat does not appear to be a UFF atom.\n"
             ,local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)&data,(string *)this->at_);
  if (data.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "UFFAdapter::getUFFParam could not find UFF\n\tparameters for atomType %s.\n",
             local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>,OpenMD::GenericData>
            ((shared_ptr<OpenMD::GenericData> *)&uffData);
  if (uffData.
      super___shared_ptr<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "UFFAdapter::getUFFParam could not convert\n\tGenericData to UFFAtypeData for atom type %s\n"
             ,local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  pUVar3 = &(uffData.
             super___shared_ptr<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->data_;
  pUVar4 = __return_storage_ptr__;
  for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
    pUVar4->r1 = pUVar3->r1;
    pUVar3 = (UFFAtypeParameters *)((long)pUVar3 + (ulong)bVar5 * -0x10 + 8);
    pUVar4 = (UFFAtypeParameters *)((long)pUVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&uffData.
              super___shared_ptr<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&data.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

UFFAtypeParameters UFFAdapter::getUFFParam() {
    if (!isUFF()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "UFFAdapter::getUFFParam was passed an atomType (%s)\n"
               "\tthat does not appear to be a UFF atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(UFFtypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "UFFAdapter::getUFFParam could not find UFF\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<UFFAtypeData> uffData =
        std::dynamic_pointer_cast<UFFAtypeData>(data);
    if (uffData == NULL) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "UFFAdapter::getUFFParam could not convert\n"
               "\tGenericData to UFFAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return uffData->getData();
  }